

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O1

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::GradX<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *cornerco,
          TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  int iVar7;
  TPZTriangleSphere<pzgeom::TPZGeoTriangle> *pTVar8;
  double *pdVar9;
  ulong uVar10;
  int i;
  Fad<double> *pFVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  value_type vVar15;
  double dVar16;
  Fad<double> b;
  Fad<double> NormValue;
  TPZVec<double> Xc;
  TPZFNMatrix<3,_Fad<double>_> XtminusXc;
  TPZFNMatrix<9,_Fad<double>_> GradOneoverNorm;
  TPZFNMatrix<9,_Fad<double>_> TensorXtGradX;
  TPZManVector<Fad<double>,_3> XTriangle;
  TPZFNMatrix<9,_Fad<double>_> GradXtScaled;
  undefined1 local_b38 [16];
  EVP_PKEY_CTX *local_b28;
  double local_b20;
  double local_b18;
  undefined8 uStack_b10;
  undefined1 local_b00 [16];
  EVP_PKEY_CTX *local_af0;
  double local_ae8;
  Fad<double> local_ae0;
  undefined1 local_ac0 [16];
  MEM_CPY<double> *local_ab0;
  double local_aa8;
  Fad<double> local_aa0;
  Fad<double> local_a80;
  TPZFMatrix<Fad<double>_> local_a60;
  TPZFMatrix<Fad<double>_> *local_9d0;
  TPZTriangleSphere<pzgeom::TPZGeoTriangle> *local_9c8;
  TPZFMatrix<double> *local_9c0;
  TPZVec<Fad<double>_> *local_9b8;
  TPZVec<double> local_9b0;
  TPZFNMatrix<3,_Fad<double>_> local_990;
  undefined1 local_880 [144];
  undefined1 local_7f0 [24];
  double *pdStack_7d8;
  Fad<double> *local_7d0;
  Fad<double> *local_7c8;
  int64_t local_7c0;
  TPZVec<int> local_7b8;
  int local_798 [6];
  undefined **local_780;
  Fad<double> *local_778;
  int64_t iStack_770;
  int64_t local_768;
  Fad<double> local_760 [10];
  undefined1 local_620 [32];
  Fad<double> *local_600;
  undefined1 local_450 [32];
  Fad<double> *local_430;
  TPZManVector<Fad<double>,_3> local_280;
  undefined1 local_200 [464];
  
  local_620._0_8_ = (_func_int **)0x0;
  local_620._8_4_ = 0;
  local_620._16_8_ = (double *)0x0;
  local_620._24_8_ = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_280,3,(Fad<double> *)local_620);
  Fad<double>::~Fad((Fad<double> *)local_620);
  local_450._0_8_ = (_func_int **)0x0;
  local_450._8_4_ = 0;
  local_450._16_8_ = (double *)0x0;
  local_450._24_8_ = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_620,3,1,(Fad<double> *)local_450);
  Fad<double>::~Fad((Fad<double> *)local_450);
  local_200._0_8_ = (_func_int **)0x0;
  local_200._8_4_ = 0;
  local_200._16_8_ = (double *)0x0;
  local_200._24_8_ = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_450,3,2,(Fad<double> *)local_200);
  Fad<double>::~Fad((Fad<double> *)local_200);
  local_7f0._0_8_ = (_func_int **)0x0;
  local_7f0._8_4_ = 0;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)0x0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_200,3,3,(Fad<double> *)local_7f0);
  Fad<double>::~Fad((Fad<double> *)local_7f0);
  TPZGeoTriangle::X<Fad<double>>(cornerco,par,&local_280.super_TPZVec<Fad<double>_>);
  local_7f0._0_8_ = (_func_int **)0x0;
  local_7f0._8_8_ = (ulong)(uint)local_7f0._12_4_ << 0x20;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)0x0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&local_990,3,1,(Fad<double> *)local_7f0);
  local_9d0 = gradx;
  local_9c0 = cornerco;
  local_9b8 = par;
  Fad<double>::~Fad((Fad<double> *)local_7f0);
  local_9c8 = this;
  TPZVec<double>::TPZVec(&local_9b0,&this->fXc);
  if (0 < local_280.super_TPZVec<Fad<double>_>.fNElements) {
    lVar13 = 0;
    do {
      pFVar11 = local_280.super_TPZVec<Fad<double>_>.fStore + lVar13;
      local_b18 = local_9b0.fStore[lVar13];
      if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow <= lVar13) ||
         (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix
          .fCol < 1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar1 = local_990.super_TPZFMatrix<Fad<double>_>.fElem + lVar13;
      uVar2 = (pFVar11->dx_).num_elts;
      uVar3 = local_990.super_TPZFMatrix<Fad<double>_>.fElem[lVar13].dx_.num_elts;
      if (uVar2 != uVar3) {
        if (uVar2 == 0) {
          if (uVar3 != 0) {
            pdVar9 = (pFVar1->dx_).ptr_to_data;
            if (pdVar9 != (double *)0x0) {
              operator_delete__(pdVar9);
            }
            (pFVar1->dx_).num_elts = 0;
            (pFVar1->dx_).ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (uVar3 != 0) {
            pdVar9 = (pFVar1->dx_).ptr_to_data;
            if (pdVar9 != (double *)0x0) {
              operator_delete__(pdVar9);
            }
            (pFVar1->dx_).num_elts = 0;
            (pFVar1->dx_).ptr_to_data = (double *)0x0;
          }
          (pFVar1->dx_).num_elts = uVar2;
          uVar14 = (long)(int)uVar2 << 3;
          if ((int)uVar2 < 0) {
            uVar14 = 0xffffffffffffffff;
          }
          pdVar9 = (double *)operator_new__(uVar14);
          (pFVar1->dx_).ptr_to_data = pdVar9;
        }
      }
      if (uVar2 != 0) {
        pdVar9 = (pFVar1->dx_).ptr_to_data;
        if ((pFVar11->dx_).num_elts == 0) {
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              pdVar9[uVar14] = pFVar11->defaultVal;
              uVar14 = uVar14 + 1;
            } while (uVar2 != uVar14);
          }
        }
        else if (0 < (int)uVar2) {
          pdVar4 = (pFVar11->dx_).ptr_to_data;
          uVar14 = 0;
          do {
            pdVar9[uVar14] = pdVar4[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar2 != uVar14);
        }
      }
      pFVar1->val_ = pFVar11->val_ - local_b18;
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_280.super_TPZVec<Fad<double>_>.fNElements);
  }
  Dot<Fad<double>>((Fad<double> *)local_880,&local_990.super_TPZFMatrix<Fad<double>_>,
                   &local_990.super_TPZFMatrix<Fad<double>_>);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt
            ((FadFuncSqrt<Fad<double>_> *)&local_a60,(Fad<double> *)local_880);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_7f0,
             (FadFuncSqrt<Fad<double>_> *)&local_a60);
  Fad<double>::~Fad((Fad<double> *)&local_a60);
  if ((double)local_7f0._8_8_ < 0.0) {
    local_b18 = sqrt((double)local_7f0._8_8_);
  }
  else {
    local_b18 = SQRT((double)local_7f0._8_8_);
  }
  Fad<double>::~Fad((Fad<double> *)(local_7f0 + 8));
  Fad<double>::~Fad((Fad<double> *)local_880);
  local_ae0.val_ = local_b18;
  local_ae0.dx_.num_elts = 0;
  local_ae0.dx_.ptr_to_data = (double *)0x0;
  local_ae0.defaultVal = 0.0;
  pFVar11 = local_760;
  local_7f0._8_8_ = 0.0;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)((ulong)pdStack_7d8 & 0xffffffffffff0000);
  local_7f0._0_8_ = &PTR__TPZFMatrix_018773e8;
  local_7c0 = 9;
  local_7d0 = pFVar11;
  local_7c8 = pFVar11;
  TPZVec<int>::TPZVec(&local_7b8,0);
  local_7b8.fStore = local_798;
  local_7b8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_7b8.fNElements = 0;
  local_7b8.fNAlloc = 0;
  local_780 = &PTR__TPZVec_01846938;
  local_778 = (Fad<double> *)0x0;
  iStack_770 = 0;
  lVar13 = 0;
  local_768 = 0;
  local_7d0 = (Fad<double> *)0x0;
  local_7f0._0_8_ = &PTR__TPZFNMatrix_018770f8;
  do {
    Fad<double>::Fad(pFVar11);
    lVar13 = lVar13 + -0x20;
    pFVar11 = pFVar11 + 1;
  } while (lVar13 != -0x140);
  TPZGeoTriangle::GradX<Fad<double>>(local_9c0,local_9b8,(TPZFMatrix<Fad<double>_> *)local_7f0);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 1) || ((long)local_7f0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_ac0._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  local_ac0._8_8_ = local_7d0;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 2) || ((long)local_7f0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b38._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1;
  local_b38._8_8_ = local_7d0 + 1;
  local_880._0_8_ = local_ac0;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 3) || ((long)local_7f0._16_8_ < 1)) {
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b00._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2;
  local_b00._8_8_ = local_7d0 + 2;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_880;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_b00;
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_880._8_8_ = local_b38;
  Fad<double>::operator=
            (local_600,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 1) || ((long)local_7f0._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_ac0._8_8_ = local_7d0 + local_7f0._8_8_;
  local_ac0._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 2) || ((long)local_7f0._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b38._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1;
  local_b38._8_8_ = local_7d0 + local_7f0._8_8_ + 1;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    local_880._0_8_ = local_ac0;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 3) || ((long)local_7f0._16_8_ < 2)) {
    local_880._0_8_ = local_ac0;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b00._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2;
  local_b00._8_8_ = local_7d0 + local_7f0._8_8_ + 2;
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)local_880;
    local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_b00;
    local_880._0_8_ = local_ac0;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_880;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_b00;
  local_880._0_8_ = local_ac0;
  local_880._8_8_ = local_b38;
  Fad<double>::operator=
            (local_600 + 1,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)&local_a60);
  pTVar8 = local_9c8;
  iVar7 = local_ae0.dx_.num_elts;
  uVar6 = local_b38._8_8_;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&local_ae0;
  local_b38._0_8_ = local_ae0.val_ * local_ae0.val_ * local_ae0.val_;
  lVar13 = (long)local_ae0.dx_.num_elts;
  local_b38._8_8_ = local_b38._8_8_ & 0xffffffff00000000;
  local_b28 = (EVP_PKEY_CTX *)0x0;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_880;
  local_880._0_8_ = local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
  local_880._8_8_ = local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
  if (0 < lVar13) {
    local_b38._12_4_ = SUB84(uVar6,4);
    local_b38._8_4_ = local_ae0.dx_.num_elts;
    local_b28 = (EVP_PKEY_CTX *)operator_new__(lVar13 * 8);
  }
  local_b20 = 0.0;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      vVar15 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                         ((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                           *)&local_a60,(int)lVar12);
      *(value_type *)(local_b28 + lVar12 * 8) = vVar15;
      lVar12 = lVar12 + 1;
    } while (lVar13 != lVar12);
  }
  uVar6 = local_b00._8_8_;
  dVar16 = pTVar8->fR;
  local_b00._0_8_ = -dVar16 / (double)local_b38._0_8_;
  uVar5 = local_b38._8_4_;
  lVar13 = (long)(int)local_b38._8_4_;
  local_b00._8_8_ = local_b00._8_8_ & 0xffffffff00000000;
  local_af0 = (EVP_PKEY_CTX *)0x0;
  if (0 < lVar13) {
    uStack_b10 = 0;
    local_b00._12_4_ = SUB84(uVar6,4);
    local_b00._8_4_ = local_b38._8_4_;
    local_b18 = dVar16;
    local_af0 = (EVP_PKEY_CTX *)operator_new__(lVar13 * 8);
    dVar16 = local_b18;
  }
  uVar6 = local_b00._8_8_;
  local_ae8 = 0.0;
  if (0 < (int)uVar5) {
    lVar12 = 0;
    do {
      *(double *)(local_af0 + lVar12 * 8) =
           (*(double *)(local_b28 + lVar12 * 8) * dVar16) /
           ((double)local_b38._0_8_ * (double)local_b38._0_8_);
      lVar12 = lVar12 + 1;
    } while (lVar13 != lVar12);
  }
  local_a80.val_ = (double)local_b00._0_8_;
  local_a80.dx_.num_elts = local_b00._8_4_;
  local_a80.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_b00._8_4_ != 0) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)local_b00._8_4_) {
      uVar14 = (long)(int)local_b00._8_4_ * 8;
    }
    local_a80.dx_.ptr_to_data = (double *)operator_new__(uVar14);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_a80.dx_.ptr_to_data,local_af0,
               (EVP_PKEY_CTX *)(uVar6 & 0xffffffff));
  }
  iVar7 = local_a80.dx_.num_elts;
  local_a80.defaultVal = local_ae8;
  local_880._0_8_ = local_a80.val_;
  local_880._8_4_ = local_a80.dx_.num_elts;
  local_880._16_8_ = (MEM_CPY<double> *)0x0;
  if ((long)local_a80.dx_.num_elts != 0) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < local_a80.dx_.num_elts) {
      uVar14 = (long)local_a80.dx_.num_elts * 8;
    }
    local_880._16_8_ = operator_new__(uVar14);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_880._16_8_,(EVP_PKEY_CTX *)local_a80.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)(uint)iVar7);
  }
  local_880._24_8_ = local_a80.defaultVal;
  TPZFMatrix<Fad<double>_>::operator*
            (&local_a60,(TPZFMatrix<Fad<double>_> *)local_620,(Fad<double> *)local_880);
  Fad<double>::~Fad((Fad<double> *)local_880);
  TPZFMatrix<Fad<double>_>::operator=((TPZFMatrix<Fad<double>_> *)local_620,&local_a60);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_a60);
  Fad<double>::~Fad(&local_a80);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 1) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(local_430,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 1) || ((long)local_450._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_),
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1);
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 2) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + 1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1);
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 2) || ((long)local_450._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_) + 1,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2);
  local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 3) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + 2,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((1 < CONCAT44(local_620._12_4_,local_620._8_4_)) && (0 < (long)local_620._16_8_)) {
    local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2);
    local_a60.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
    if ((2 < CONCAT44(local_450._12_4_,local_450._8_4_)) && (1 < (long)local_450._16_8_)) {
      Fad<double>::operator=
                (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_) + 2,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a60);
      iVar7 = local_ae0.dx_.num_elts;
      dVar16 = pTVar8->fR;
      uVar14 = (ulong)(uint)local_ae0.dx_.num_elts;
      if (local_ae0.dx_.num_elts != local_b38._8_4_) {
        if (local_ae0.dx_.num_elts == 0) {
          if (local_b38._8_4_ != 0) {
            if (local_b28 != (EVP_PKEY_CTX *)0x0) {
              local_b18 = dVar16;
              operator_delete__(local_b28);
              dVar16 = local_b18;
            }
            local_b38._8_8_ = local_b38._8_8_ & 0xffffffff00000000;
            local_b28 = (EVP_PKEY_CTX *)0x0;
          }
        }
        else {
          lVar13 = (long)local_ae0.dx_.num_elts;
          local_b18 = dVar16;
          if (local_b38._8_4_ != 0) {
            if (local_b28 != (EVP_PKEY_CTX *)0x0) {
              operator_delete__(local_b28);
            }
            local_b38._8_8_ = local_b38._8_8_ & 0xffffffff00000000;
            local_b28 = (EVP_PKEY_CTX *)0x0;
          }
          local_b38._8_4_ = iVar7;
          uVar10 = 0xffffffffffffffff;
          if (-1 < iVar7) {
            uVar10 = lVar13 << 3;
          }
          local_b28 = (EVP_PKEY_CTX *)operator_new__(uVar10);
          dVar16 = local_b18;
        }
      }
      uVar6 = local_b38._8_8_;
      if (iVar7 != 0) {
        if (local_ae0.dx_.num_elts == 0) {
          if (0 < iVar7) {
            uVar10 = 0;
            do {
              *(double *)(local_b28 + uVar10 * 8) =
                   (-local_ae0.defaultVal * dVar16) / (local_ae0.val_ * local_ae0.val_);
              uVar10 = uVar10 + 1;
            } while (uVar14 != uVar10);
          }
        }
        else if (0 < iVar7) {
          uVar10 = 0;
          do {
            *(double *)(local_b28 + uVar10 * 8) =
                 (-local_ae0.dx_.ptr_to_data[uVar10] * dVar16) / (local_ae0.val_ * local_ae0.val_);
            uVar10 = uVar10 + 1;
          } while (uVar14 != uVar10);
        }
      }
      local_b38._0_8_ = dVar16 / local_ae0.val_;
      local_aa0.dx_.num_elts = local_b38._8_4_;
      local_aa0.dx_.ptr_to_data = (double *)0x0;
      local_aa0.val_ = (double)local_b38._0_8_;
      if ((long)(int)local_b38._8_4_ != 0) {
        uVar14 = 0xffffffffffffffff;
        if (-1 < (int)local_b38._8_4_) {
          uVar14 = (long)(int)local_b38._8_4_ * 8;
        }
        local_aa0.dx_.ptr_to_data = (double *)operator_new__(uVar14);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_aa0.dx_.ptr_to_data,local_b28,
                   (EVP_PKEY_CTX *)(uVar6 & 0xffffffff));
      }
      iVar7 = local_aa0.dx_.num_elts;
      local_aa0.defaultVal = local_b20;
      local_ac0._0_8_ = local_aa0.val_;
      local_ac0._8_4_ = local_aa0.dx_.num_elts;
      local_ab0 = (MEM_CPY<double> *)0x0;
      if ((long)local_aa0.dx_.num_elts != 0) {
        uVar14 = 0xffffffffffffffff;
        if (-1 < local_aa0.dx_.num_elts) {
          uVar14 = (long)local_aa0.dx_.num_elts * 8;
        }
        local_ab0 = (MEM_CPY<double> *)operator_new__(uVar14);
        MEM_CPY<double>::copy
                  (local_ab0,(EVP_PKEY_CTX *)local_aa0.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)(ulong)(uint)iVar7);
      }
      local_aa8 = local_aa0.defaultVal;
      TPZFMatrix<Fad<double>_>::operator*
                ((TPZFMatrix<Fad<double>_> *)local_880,(TPZFMatrix<Fad<double>_> *)local_7f0,
                 (Fad<double> *)local_ac0);
      Fad<double>::~Fad((Fad<double> *)local_ac0);
      TPZFMatrix<Fad<double>_>::operator+
                (&local_a60,(TPZFMatrix<Fad<double>_> *)local_880,
                 (TPZFMatrix<Fad<double>_> *)local_450);
      TPZFMatrix<Fad<double>_>::operator=(local_9d0,&local_a60);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_a60);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_880);
      Fad<double>::~Fad(&local_aa0);
      Fad<double>::~Fad((Fad<double> *)local_b00);
      Fad<double>::~Fad((Fad<double> *)local_b38);
      local_7f0._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar13 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_7f0 + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_7f0,&PTR_PTR_018773b0)
      ;
      Fad<double>::~Fad(&local_ae0);
      local_9b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if (local_9b0.fStore != (double *)0x0) {
        operator_delete__(local_9b0.fStore);
      }
      local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01877ab8;
      lVar13 = 0xf0;
      do {
        Fad<double>::~Fad((Fad<double> *)
                          ((long)&((TPZFMatrix<Fad<double>_> *)
                                  (&((TPZFMatrix<Fad<double>_> *)
                                    (&local_990.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot
                                  + -1))->fPivot + lVar13 + 0xffffffffffffffc8U));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix
                (&local_990.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01877d70);
      local_200._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar13 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_200 + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_200,&PTR_PTR_018773b0)
      ;
      local_450._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar13 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_450 + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_450,&PTR_PTR_018773b0)
      ;
      local_620._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar13 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_620 + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_620,&PTR_PTR_018773b0)
      ;
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_280);
      return;
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZManVector<T,3> XTriangle(3,0.0);
            TPZFNMatrix<9,T> GradOneoverNorm(3,1,0.0);
            TPZFNMatrix<9,T> TensorXtGradX(3,2,0.0);
            TPZFNMatrix<9,T> GradXtScaled(3,3,0.0);
            
            //            TPZFNMatrix<3*NNodes> coord(3,NNodes);
            //            CornerCoordinates(gel, coord);
            
            GeomTriang::X(cornerco,par,XTriangle);
            TPZFNMatrix<3,T> XtminusXc(3,1,0.0);
            TPZVec<REAL> Xc= fXc;
            
            for (int i = 0; i < XTriangle.size(); i++)
            { XtminusXc(i,0)= XTriangle[i] - Xc[i]; }
            T NormValue = Norm(XtminusXc);
            
            
            TPZFNMatrix<9,T> GradXt;
            GeomTriang::GradX(cornerco,par,GradXt);
            
            GradOneoverNorm(0,0) = XtminusXc(0,0)*GradXt(0,0)+XtminusXc(1,0)*GradXt(1,0)+XtminusXc(2,0)*GradXt(2,0);
            GradOneoverNorm(1,0) = XtminusXc(0,0)*GradXt(0,1)+XtminusXc(1,0)*GradXt(1,1)+XtminusXc(2,0)*GradXt(2,1);
            T a = (NormValue*NormValue*NormValue);
            T b = -fR/a;
            GradOneoverNorm = b*GradOneoverNorm;
            
            TensorXtGradX(0,0)= XtminusXc(0,0)*GradOneoverNorm(0,0);
            TensorXtGradX(0,1)= XtminusXc(0,0)*GradOneoverNorm(1,0);
            TensorXtGradX(1,0)= XtminusXc(1,0)*GradOneoverNorm(0,0);
            TensorXtGradX(1,1)= XtminusXc(1,0)*GradOneoverNorm(1,0);
            TensorXtGradX(2,0)= XtminusXc(2,0)*GradOneoverNorm(0,0);
            TensorXtGradX(2,1)= XtminusXc(2,0)*GradOneoverNorm(1,0);
            a = fR/NormValue;
            gradx=a*GradXt+TensorXtGradX;

        }